

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O1

void __thiscall
webrtc::NonlinearBeamformer::NonlinearBeamformer
          (NonlinearBeamformer *this,
          vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
          *array_geometry,SphericalPointf target_direction)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  Optional<webrtc::CartesianPoint<float>_> OVar9;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_> local_68;
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = target_direction.s._0_8_;
  local_48._12_4_ = in_XMM0_Dd;
  (this->super_Beamformer<float>)._vptr_Beamformer =
       (_func_int **)&PTR__NonlinearBeamformer_001d0328;
  (this->super_Callback)._vptr_Callback = (_func_int **)&PTR__NonlinearBeamformer_001d0378;
  (this->lapped_transform_)._M_t.
  super___uniq_ptr_impl<webrtc::LappedTransform,_std::default_delete<webrtc::LappedTransform>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::LappedTransform_*,_std::default_delete<webrtc::LappedTransform>_>.
  super__Head_base<0UL,_webrtc::LappedTransform_*,_false>._M_head_impl = (LappedTransform *)0x0;
  this->num_input_channels_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  std::vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
  vector(&local_68,array_geometry);
  uVar2 = ((long)local_68.
                 super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_68.
                 super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  lVar3 = uVar2 + (uVar2 == 0);
  lVar4 = 0;
  pfVar5 = (local_68.
            super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->c;
  do {
    fVar8 = 0.0;
    pfVar6 = pfVar5;
    lVar7 = lVar3;
    if (local_68.
        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        fVar8 = fVar8 + *pfVar6;
        lVar7 = lVar7 + -1;
        pfVar6 = pfVar6 + 3;
      } while (lVar7 != 0);
    }
    if (local_68.
        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pfVar6 = pfVar5;
      lVar7 = lVar3;
      do {
        *pfVar6 = *pfVar6 - fVar8 / (float)uVar2;
        pfVar6 = pfVar6 + 3;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    lVar4 = lVar4 + 1;
    pfVar5 = pfVar5 + 1;
  } while (lVar4 != 3);
  (this->array_geometry_).
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->array_geometry_).
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->array_geometry_).
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OVar9 = GetArrayNormalIfExists(array_geometry);
  *(long *)(this->array_normal_).value_.c = OVar9.value_.c._0_8_;
  (this->array_normal_).value_.c[2] = OVar9.value_.c[2];
  (this->array_normal_).has_value_ = OVar9.has_value_;
  fVar8 = GetMinimumSpacing(array_geometry);
  this->min_mic_spacing_ = fVar8;
  this->target_angle_radians_ = (float)local_48._0_4_;
  (this->interf_angles_radians_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interf_angles_radians_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar8 = 0.025132744 / fVar8;
  if (fVar8 <= 0.2) {
    fVar8 = 0.2;
  }
  if (3.1415927 <= fVar8) {
    fVar8 = 3.1415927;
  }
  (this->interf_angles_radians_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->away_radians_ = fVar8;
  lVar3 = 0xab8;
  do {
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)((long)this->window_ + lVar3 + -0x28) = &PTR__Matrix_001d02f0;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0x4730);
  lVar3 = 0x4730;
  do {
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)((long)this->window_ + lVar3 + -0x28) = &PTR__Matrix_001d02f0;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0x83a8);
  lVar3 = 0x83a8;
  do {
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)((long)this->window_ + lVar3 + -0x28) = &PTR__Matrix_001d02f0;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0xc020);
  lVar3 = 0xc020;
  do {
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->window_ + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)((long)this->window_ + lVar3 + -0x28) = &PTR__Matrix_001d02f0;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0xfc98);
  memset(this->interf_cov_mats_,0,0xc18);
  memset(this->rpsiws_,0,0xc18);
  (this->eig_m_).super_Matrix<std::complex<float>_>.num_rows_ = 0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.num_columns_ = 0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>._vptr_Matrix =
       (_func_int **)&PTR__Matrix_001d02f0;
  WindowGenerator::KaiserBesselDerived(1.5,0x100,this->window_);
  return;
}

Assistant:

NonlinearBeamformer::NonlinearBeamformer(
    const std::vector<Point>& array_geometry,
    SphericalPointf target_direction)
    : num_input_channels_(array_geometry.size()),
      array_geometry_(GetCenteredArray(array_geometry)),
      array_normal_(GetArrayNormalIfExists(array_geometry)),
      min_mic_spacing_(GetMinimumSpacing(array_geometry)),
      target_angle_radians_(target_direction.azimuth()),
      away_radians_(std::min(
          static_cast<float>(M_PI),
          std::max(kMinAwayRadians,
                   kAwaySlope * static_cast<float>(M_PI) / min_mic_spacing_))) {
  WindowGenerator::KaiserBesselDerived(kKbdAlpha, kFftSize, window_);
}